

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

size_t colamd_recommended(int nnz,int n_row,int n_col)

{
  size_t sVar1;
  size_t local_48;
  int local_3c;
  ulong uStack_38;
  int ok;
  size_t r;
  size_t c;
  size_t s;
  int local_18;
  int n_col_local;
  int n_row_local;
  int nnz_local;
  
  local_3c = 1;
  if (((nnz < 0) || (n_row < 0)) || (n_col < 0)) {
    _n_row_local = 0;
  }
  else {
    s._4_4_ = n_col;
    local_18 = n_row;
    n_col_local = nnz;
    c = t_mult((long)nnz,2,&local_3c);
    sVar1 = t_add((long)s._4_4_,1,&local_3c);
    sVar1 = t_mult(sVar1,0x18,&local_3c);
    r = sVar1 >> 2;
    sVar1 = t_add((long)local_18,1,&local_3c);
    sVar1 = t_mult(sVar1,0x10,&local_3c);
    uStack_38 = sVar1 >> 2;
    c = t_add(c,r,&local_3c);
    c = t_add(c,uStack_38,&local_3c);
    c = t_add(c,(long)s._4_4_,&local_3c);
    local_48 = t_add(c,(long)(n_col_local / 5),&local_3c);
    if (local_3c == 0 || 0x7ffffffe < local_48) {
      local_48 = 0;
    }
    _n_row_local = local_48;
  }
  return _n_row_local;
}

Assistant:

PUBLIC size_t COLAMD_recommended	/* returns recommended value of Alen. */
(
    /* === Parameters ======================================================= */

    Int nnz,			/* number of nonzeros in A */
    Int n_row,			/* number of rows in A */
    Int n_col			/* number of columns in A */
)
{
    size_t s, c, r ;
    int ok = TRUE ;
    if (nnz < 0 || n_row < 0 || n_col < 0)
    {
	return (0) ;
    }
    s = t_mult (nnz, 2, &ok) ;	    /* 2*nnz */
    c = COLAMD_C (n_col, &ok) ;	    /* size of column structures */
    r = COLAMD_R (n_row, &ok) ;	    /* size of row structures */
    s = t_add (s, c, &ok) ;
    s = t_add (s, r, &ok) ;
    s = t_add (s, n_col, &ok) ;	    /* elbow room */
    s = t_add (s, nnz/5, &ok) ;	    /* elbow room */
    ok = ok && (s < Int_MAX) ;
    return (ok ? s : 0) ;
}